

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O0

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData *draw_data)

{
  ImDrawList **ppIVar1;
  ImTextureID pvVar2;
  long in_RDI;
  ImVec2 clip_max;
  ImVec2 clip_min;
  ImDrawCmd *pcmd;
  int cmd_i;
  uint *idx_buffer;
  ImDrawVert *vtx_buffer;
  ImDrawList *cmd_list;
  int n;
  ImVec2 clip_scale;
  ImVec2 clip_off;
  GLint last_tex_env_mode;
  GLint last_shade_model;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  GLint last_texture;
  int fb_height;
  int fb_width;
  PFNGLBINDTEXTUREPROC in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  ImVec2 local_98;
  ImDrawCmd *local_90;
  int local_84;
  uint *local_80;
  ImDrawVert *local_78;
  ImDrawList *local_70;
  int local_64;
  undefined8 local_60;
  undefined8 local_58;
  GLint local_50;
  GLenum local_4c;
  GLint local_48;
  GLint local_44;
  GLsizei local_40;
  GLsizei local_3c;
  GLint local_38;
  GLint local_34;
  GLsizei local_30;
  GLsizei local_2c;
  GLenum local_1c;
  GLenum local_18;
  GLuint local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_c = (int)(*(float *)(in_RDI + 0x28) * *(float *)(in_RDI + 0x30));
  local_10 = (int)(*(float *)(in_RDI + 0x2c) * *(float *)(in_RDI + 0x34));
  if ((local_c != 0) && (local_10 != 0)) {
    local_8 = in_RDI;
    (*glad_glGetIntegerv)(0x8069,(GLint *)&local_14);
    (*glad_glGetIntegerv)(0xb40,(GLint *)&local_1c);
    (*glad_glGetIntegerv)(0xba2,&local_38);
    (*glad_glGetIntegerv)(0xc10,&local_48);
    (*glad_glGetIntegerv)(0xb54,(GLint *)&local_4c);
    (*glad_glGetTexEnviv)(0x2300,0x2200,&local_50);
    (*glad_glPushAttrib)(0x7000);
    ImGui_ImplOpenGL2_SetupRenderState
              ((ImDrawData *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),(int)in_stack_ffffffffffffff58);
    local_58 = *(undefined8 *)(local_8 + 0x20);
    local_60 = *(undefined8 *)(local_8 + 0x30);
    for (local_64 = 0; local_64 < *(int *)(local_8 + 4); local_64 = local_64 + 1) {
      ppIVar1 = ImVector<ImDrawList_*>::operator[]
                          ((ImVector<ImDrawList_*> *)(local_8 + 0x10),local_64);
      local_70 = *ppIVar1;
      local_78 = (local_70->VtxBuffer).Data;
      local_80 = (local_70->IdxBuffer).Data;
      (*glad_glVertexPointer)(2,0x1406,0x14,local_78);
      (*glad_glTexCoordPointer)(2,0x1406,0x14,&local_78->uv);
      (*glad_glColorPointer)(4,0x1401,0x14,&local_78->col);
      for (local_84 = 0; local_84 < (local_70->CmdBuffer).Size; local_84 = local_84 + 1) {
        local_90 = ImVector<ImDrawCmd>::operator[](&local_70->CmdBuffer,local_84);
        if (local_90->UserCallback == (ImDrawCallback)0x0) {
          ImVec2::ImVec2(&local_98,((local_90->ClipRect).x - (float)local_58) * (float)local_60,
                         ((local_90->ClipRect).y - local_58._4_4_) * local_60._4_4_);
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff60,
                         ((local_90->ClipRect).z - (float)local_58) * (float)local_60,
                         ((local_90->ClipRect).w - local_58._4_4_) * local_60._4_4_);
          if ((local_98.x < in_stack_ffffffffffffff60) && (local_98.y < in_stack_ffffffffffffff64))
          {
            (*glad_glScissor)((int)local_98.x,(int)((float)local_10 - in_stack_ffffffffffffff64),
                              (int)(in_stack_ffffffffffffff60 - local_98.x),
                              (int)(in_stack_ffffffffffffff64 - local_98.y));
            in_stack_ffffffffffffff58 = glad_glBindTexture;
            pvVar2 = ImDrawCmd::GetTexID(local_90);
            (*in_stack_ffffffffffffff58)(0xde1,(GLuint)pvVar2);
            (*glad_glDrawElements)(4,local_90->ElemCount,0x1405,local_80 + local_90->IdxOffset);
          }
        }
        else if (local_90->UserCallback == (ImDrawCallback)0xfffffffffffffff8) {
          ImGui_ImplOpenGL2_SetupRenderState
                    ((ImDrawData *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),(int)in_stack_ffffffffffffff58)
          ;
        }
        else {
          (*local_90->UserCallback)(local_70,local_90);
        }
      }
    }
    (*glad_glDisableClientState)(0x8076);
    (*glad_glDisableClientState)(0x8078);
    (*glad_glDisableClientState)(0x8074);
    (*glad_glBindTexture)(0xde1,local_14);
    (*glad_glMatrixMode)(0x1700);
    (*glad_glPopMatrix)();
    (*glad_glMatrixMode)(0x1701);
    (*glad_glPopMatrix)();
    (*glad_glPopAttrib)();
    (*glad_glPolygonMode)(0x404,local_1c);
    (*glad_glPolygonMode)(0x405,local_18);
    (*glad_glViewport)(local_38,local_34,local_30,local_2c);
    (*glad_glScissor)(local_48,local_44,local_40,local_3c);
    (*glad_glShadeModel)(local_4c);
    (*glad_glTexEnvi)(0x2300,0x2200,local_50);
  }
  return;
}

Assistant:

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width == 0 || fb_height == 0)
        return;

    // Backup GL state
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLint last_shade_model; glGetIntegerv(GL_SHADE_MODEL, &last_shade_model);
    GLint last_tex_env_mode; glGetTexEnviv(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, &last_tex_env_mode);
    glPushAttrib(GL_ENABLE_BIT | GL_COLOR_BUFFER_BIT | GL_TRANSFORM_BIT);

    // Setup desired GL state
    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawVert* vtx_buffer = cmd_list->VtxBuffer.Data;
        const ImDrawIdx* idx_buffer = cmd_list->IdxBuffer.Data;
        glVertexPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + offsetof(ImDrawVert, pos)));
        glTexCoordPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + offsetof(ImDrawVert, uv)));
        glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + offsetof(ImDrawVert, col)));

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec2 clip_min((pcmd->ClipRect.x - clip_off.x) * clip_scale.x, (pcmd->ClipRect.y - clip_off.y) * clip_scale.y);
                ImVec2 clip_max((pcmd->ClipRect.z - clip_off.x) * clip_scale.x, (pcmd->ClipRect.w - clip_off.y) * clip_scale.y);
                if (clip_max.x <= clip_min.x || clip_max.y <= clip_min.y)
                    continue;

                // Apply scissor/clipping rectangle (Y is inverted in OpenGL)
                glScissor((int)clip_min.x, (int)((float)fb_height - clip_max.y), (int)(clip_max.x - clip_min.x), (int)(clip_max.y - clip_min.y));

                // Bind texture, Draw
                glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->GetTexID());
                glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer + pcmd->IdxOffset);
            }
        }
    }

    // Restore modified GL state
    glDisableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_VERTEX_ARRAY);
    glBindTexture(GL_TEXTURE_2D, (GLuint)last_texture);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]); glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]);
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
    glShadeModel(last_shade_model);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, last_tex_env_mode);
}